

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Processor * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,Processor *p)

{
  ModuleBase *pMVar1;
  Processor *pPVar2;
  
  pMVar1 = (this->currentModule).object;
  (this->currentModule).object = (ModuleBase *)p;
  pPVar2 = ModuleInstanceResolver::visitModule<soul::AST::Processor>
                     (&this->super_ModuleInstanceResolver,p);
  (this->currentModule).object = pMVar1;
  return pPVar2;
}

Assistant:

AST::Processor& visit (AST::Processor& p) override
        {
            auto lastModule = currentModule;
            currentModule = p;
            auto& result = ModuleInstanceResolver::visit (p);
            currentModule = lastModule;
            return result;
        }